

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDefinedMeasurementCollector.cpp
# Opt level: O0

void __thiscall
celero::UserDefinedMeasurementCollector::collect
          (UserDefinedMeasurementCollector *this,shared_ptr<celero::TestFixture> *fixture)

{
  bool bVar1;
  element_type *peVar2;
  reference psVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar6;
  key_type local_c8;
  key_type local_a8;
  key_type local_78;
  undefined1 local_58 [8];
  shared_ptr<celero::UserDefinedMeasurement> udm;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  *__range2;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  udms;
  shared_ptr<celero::TestFixture> *fixture_local;
  UserDefinedMeasurementCollector *this_local;
  
  udms.
  super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fixture;
  peVar2 = std::__shared_ptr_access<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)fixture);
  (*peVar2->_vptr_TestFixture[9])(&__range2);
  bVar1 = std::
          vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
          ::empty((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                   *)&__range2);
  if (!bVar1) {
    __end2 = std::
             vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             ::begin((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                      *)&__range2);
    udm.super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
            ::end((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                   *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
                                       *)&udm.
                                          super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar1) {
      psVar3 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
               ::operator*(&__end2);
      std::shared_ptr<celero::UserDefinedMeasurement>::shared_ptr
                ((shared_ptr<celero::UserDefinedMeasurement> *)local_58,psVar3);
      peVar4 = std::
               __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      (**(code **)(*(long *)peVar4 + 0x18))(&local_78);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
               ::operator[](&this->collected,&local_78);
      bVar1 = std::operator==(pmVar5,(nullptr_t)0x0);
      std::__cxx11::string::~string((string *)&local_78);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
        (**(code **)(*(long *)peVar4 + 0x18))(&local_a8);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
                 ::operator[](&this->collected,&local_a8);
        std::shared_ptr<celero::UserDefinedMeasurement>::operator=
                  (pmVar5,(shared_ptr<celero::UserDefinedMeasurement> *)local_58);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
        (**(code **)(*(long *)peVar4 + 0x18))(&local_c8);
        this_00 = (__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
                     ::operator[](&this->collected,&local_c8);
        peVar4 = std::
                 __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        peVar6 = std::
                 __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_58);
        (**(code **)(*(long *)peVar4 + 0x20))(peVar4,peVar6);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      std::shared_ptr<celero::UserDefinedMeasurement>::~shared_ptr
                ((shared_ptr<celero::UserDefinedMeasurement> *)local_58);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ::~vector((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             *)&__range2);
  return;
}

Assistant:

void UserDefinedMeasurementCollector::collect(std::shared_ptr<TestFixture> fixture)
{
	const auto udms = fixture->getUserDefinedMeasurements();

	if(udms.empty() == false)
	{
		for(auto udm : udms)
		{
			if(this->collected[udm->getName()] == nullptr)
			{
				this->collected[udm->getName()] = udm;
			}
			else
			{
				this->collected[udm->getName()]->merge(&*udm);
			}
		}
	}
}